

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::lockedFinish
          (DefaultThreadPoolProvider *this)

{
  element_type *peVar1;
  DefaultThreadPoolData *pDVar2;
  size_t i_1;
  size_t i;
  size_t curT;
  DefaultThreadPoolData *this_00;
  DefaultThreadPoolData *local_18;
  
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10982b);
  DefaultThreadPoolData::stop((DefaultThreadPoolData *)0x109833);
  peVar1 = std::
           __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x109840);
  pDVar2 = (DefaultThreadPoolData *)
           std::vector<std::thread,_std::allocator<std::thread>_>::size(&peVar1->_threads);
  for (local_18 = (DefaultThreadPoolData *)0x0; local_18 != pDVar2;
      local_18 = (DefaultThreadPoolData *)((long)&(local_18->_taskSemaphore)._vptr_Semaphore + 1)) {
    std::
    __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x109876);
    Semaphore::post((Semaphore *)i);
  }
  for (this_00 = (DefaultThreadPoolData *)0x0; this_00 != pDVar2;
      this_00 = (DefaultThreadPoolData *)((long)&(this_00->_taskSemaphore)._vptr_Semaphore + 1)) {
    peVar1 = std::
             __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1098b0);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              (&peVar1->_threads,(size_type)this_00);
    std::thread::join();
  }
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1098e9);
  std::vector<std::thread,_std::allocator<std::thread>_>::clear
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1098f8);
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x109905);
  DefaultThreadPoolData::resetAtomics(this_00);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::lockedFinish ()
{
    _data->stop ();

    //
    // Signal enough times to allow all threads to stop.
    //
    // NB: we must do this as many times as we have threads.
    //
    // If there is still work in the queue, or this call happens "too
    // quickly", threads will not be waiting on the semaphore, so we
    // need to ensure the semaphore is at a count equal to the amount
    // of work left plus the number of threads to ensure exit of a
    // thread. There can be threads in a few states:
    //   - still starting up (successive calls to setNumThreads)
    //   - in the middle of processing a task / looping
    //   - waiting in the semaphore
    size_t curT = _data->_threads.size ();
    for (size_t i = 0; i != curT; ++i)
        _data->_taskSemaphore.post ();

    //
    // We should not need to check joinability, they should all, by
    // definition, be joinable (assuming normal start)
    //
    for (size_t i = 0; i != curT; ++i)
    {
        // This isn't quite right in that the thread may have actually
        // be in an exited / signalled state (needing the
        // WaitForSingleObject call), and so already have an exit code
        // (I think, but the docs are vague), but if we don't do the
        // join, the stl thread seems to then throw an exception. The
        // join should just return invalid handle and continue, and is
        // more of a windows bug... except maybe someone needs to work
        // around it...
        //#    ifdef TEST_FOR_WIN_THREAD_STATUS
        //
        //        // per OIIO issue #2038, on exit / dll unload, windows may
        //        // kill the thread, double check that it is still active prior
        //        // to joining.
        //        DWORD tstatus;
        //        if (GetExitCodeThread (_threads[i].native_handle (), &tstatus))
        //        {
        //            if (tstatus != STILL_ACTIVE) { continue; }
        //        }
        //#    endif

        _data->_threads[i].join ();
    }

    _data->_threads.clear ();

    _data->resetAtomics ();
}